

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input.cxx
# Opt level: O1

int __thiscall Fl_Input::kf_clear_eol(Fl_Input *this)

{
  int iVar1;
  int iVar2;
  
  if (((this->super_Fl_Input_).super_Fl_Widget.type_ & 8) == 0) {
    iVar1 = (this->super_Fl_Input_).position_;
    iVar2 = 0;
    if (iVar1 < (this->super_Fl_Input_).size_) {
      iVar1 = Fl_Input_::line_end(&this->super_Fl_Input_,iVar1);
      iVar2 = (this->super_Fl_Input_).position_;
      Fl_Input_::replace(&this->super_Fl_Input_,iVar2,
                         (uint)(iVar1 < (this->super_Fl_Input_).size_ && iVar1 == iVar2) + iVar1,
                         (char *)0x0,0);
      iVar2 = Fl_Input_::copy_cuts(&this->super_Fl_Input_);
      return iVar2;
    }
  }
  else {
    fl_beep(0);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int Fl_Input::kf_clear_eol() {
  if (readonly()) { fl_beep(); return 1; }
  if (position()>=size()) return 0;
  int i = line_end(position());
  if (i == position() && i < size()) i++;
  cut(position(), i);
  return copy_cuts();
}